

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

CURLcode Curl_pp_vsendf(Curl_easy *data,pingpong *pp,char *fmt,__va_list_tag *args)

{
  char *pcVar1;
  size_t blen;
  char *ptr;
  curltime cVar2;
  undefined4 uStack_5c;
  connectdata *conn;
  CURLcode result;
  char *s;
  size_t write_len;
  ssize_t bytes_written;
  __va_list_tag *args_local;
  char *fmt_local;
  pingpong *pp_local;
  Curl_easy *data_local;
  
  write_len = 0;
  if (data->conn == (connectdata *)0x0) {
    data_local._4_4_ = CURLE_SEND_ERROR;
  }
  else {
    bytes_written = (ssize_t)args;
    args_local = (__va_list_tag *)fmt;
    fmt_local = (char *)pp;
    pp_local = (pingpong *)data;
    Curl_dyn_reset(&pp->sendbuf);
    data_local._4_4_ =
         Curl_dyn_vaddf((dynbuf *)(fmt_local + 0x40),(char *)args_local,
                        (__va_list_tag *)bytes_written);
    if ((data_local._4_4_ == CURLE_OK) &&
       (data_local._4_4_ = Curl_dyn_addn((dynbuf *)(fmt_local + 0x40),"\r\n",2),
       data_local._4_4_ == CURLE_OK)) {
      fmt_local[8] = '\x01';
      blen = Curl_dyn_len((dynbuf *)(fmt_local + 0x40));
      ptr = Curl_dyn_ptr((dynbuf *)(fmt_local + 0x40));
      data_local._4_4_ = Curl_nwrite((Curl_easy *)pp_local,0,ptr,blen,(ssize_t *)&write_len);
      if (data_local._4_4_ == CURLE_OK) {
        Curl_debug((Curl_easy *)pp_local,CURLINFO_HEADER_OUT,ptr,write_len);
        pcVar1 = fmt_local;
        if (write_len == blen) {
          fmt_local[0x10] = '\0';
          fmt_local[0x11] = '\0';
          fmt_local[0x12] = '\0';
          fmt_local[0x13] = '\0';
          fmt_local[0x14] = '\0';
          fmt_local[0x15] = '\0';
          fmt_local[0x16] = '\0';
          fmt_local[0x17] = '\0';
          fmt_local[0x20] = '\0';
          fmt_local[0x21] = '\0';
          fmt_local[0x22] = '\0';
          fmt_local[0x23] = '\0';
          fmt_local[0x24] = '\0';
          fmt_local[0x25] = '\0';
          fmt_local[0x26] = '\0';
          fmt_local[0x27] = '\0';
          fmt_local[0x18] = '\0';
          fmt_local[0x19] = '\0';
          fmt_local[0x1a] = '\0';
          fmt_local[0x1b] = '\0';
          fmt_local[0x1c] = '\0';
          fmt_local[0x1d] = '\0';
          fmt_local[0x1e] = '\0';
          fmt_local[0x1f] = '\0';
          cVar2 = Curl_now();
          *(time_t *)(pcVar1 + 0x28) = cVar2.tv_sec;
          *(ulong *)(pcVar1 + 0x30) = CONCAT44(uStack_5c,cVar2.tv_usec);
        }
        else {
          *(char **)(fmt_local + 0x10) = ptr;
          *(size_t *)(fmt_local + 0x20) = blen;
          *(size_t *)(fmt_local + 0x18) = blen - write_len;
        }
        data_local._4_4_ = CURLE_OK;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_pp_vsendf(struct Curl_easy *data,
                        struct pingpong *pp,
                        const char *fmt,
                        va_list args)
{
  ssize_t bytes_written = 0;
  size_t write_len;
  char *s;
  CURLcode result;
  struct connectdata *conn = data->conn;

#ifdef HAVE_GSSAPI
  enum protection_level data_sec;
#endif

  DEBUGASSERT(pp->sendleft == 0);
  DEBUGASSERT(pp->sendsize == 0);
  DEBUGASSERT(pp->sendthis == NULL);

  if(!conn)
    /* can't send without a connection! */
    return CURLE_SEND_ERROR;

  Curl_dyn_reset(&pp->sendbuf);
  result = Curl_dyn_vaddf(&pp->sendbuf, fmt, args);
  if(result)
    return result;

  /* append CRLF */
  result = Curl_dyn_addn(&pp->sendbuf, "\r\n", 2);
  if(result)
    return result;

  pp->pending_resp = TRUE;
  write_len = Curl_dyn_len(&pp->sendbuf);
  s = Curl_dyn_ptr(&pp->sendbuf);

#ifdef HAVE_GSSAPI
  conn->data_prot = PROT_CMD;
#endif
  result = Curl_nwrite(data, FIRSTSOCKET, s, write_len, &bytes_written);
  if(result)
    return result;
#ifdef HAVE_GSSAPI
  data_sec = conn->data_prot;
  DEBUGASSERT(data_sec > PROT_NONE && data_sec < PROT_LAST);
  conn->data_prot = (unsigned char)data_sec;
#endif

  Curl_debug(data, CURLINFO_HEADER_OUT, s, (size_t)bytes_written);

  if(bytes_written != (ssize_t)write_len) {
    /* the whole chunk was not sent, keep it around and adjust sizes */
    pp->sendthis = s;
    pp->sendsize = write_len;
    pp->sendleft = write_len - bytes_written;
  }
  else {
    pp->sendthis = NULL;
    pp->sendleft = pp->sendsize = 0;
    pp->response = Curl_now();
  }

  return CURLE_OK;
}